

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.h
# Opt level: O3

void __thiscall
chrono::ChLoad<chrono::ChLoaderGravity>::ComputeJacobian
          (ChLoad<chrono::ChLoaderGravity> *this,ChState *state_x,ChStateDelta *state_w,
          ChMatrixRef *mK,ChMatrixRef *mR,ChMatrixRef *mM)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  Index IVar13;
  int iVar14;
  int iVar15;
  Index index_1;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  char *__function;
  long lVar19;
  double *pdVar20;
  ActualDstType actualDst;
  ulong uVar21;
  ulong size_00;
  Index size;
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  ChVectorDynamic<> Q1;
  ChVectorDynamic<> Jcolumn;
  ChVectorDynamic<> Q0;
  ChStateDelta state_delta;
  ChState state_x_inc;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_c8;
  ChLoad<chrono::ChLoaderGravity> *local_b0;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_a8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_98;
  int local_7c;
  ChStateDelta *local_78;
  ChLoaderGravity *local_70;
  ChState *local_68;
  ChStateDelta local_60;
  ChState local_48;
  
  iVar14 = (**(code **)(*(long *)this + 0x38))();
  iVar15 = (**(code **)(*(long *)this + 0x30))(this);
  size_00 = (ulong)iVar14;
  local_98.m_storage.m_data = (double *)0x0;
  local_98.m_storage.m_rows = 0;
  local_7c = iVar14;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_98,size_00);
  local_70 = &this->loader;
  local_b0 = this;
  ChLoaderUVWdistributed::ComputeQ
            (&local_70->super_ChLoaderUVWdistributed,&state_x->super_ChVectorDynamic<double>,
             &state_w->super_ChVectorDynamic<double>);
  pdVar20 = (local_b0->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.super_ChLoader.Q.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  uVar21 = *(Index *)((long)&(local_b0->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.
                             super_ChLoader.Q.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage + 8);
  if (local_98.m_storage.m_rows != uVar21) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_98,uVar21,1);
    if (local_98.m_storage.m_rows != uVar21) {
LAB_00126f54:
      __function = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
      ;
      goto LAB_00126f80;
    }
  }
  uVar17 = uVar21 + 7;
  if (-1 < (long)uVar21) {
    uVar17 = uVar21;
  }
  uVar17 = uVar17 & 0xfffffffffffffff8;
  if (7 < (long)uVar21) {
    lVar19 = 0;
    do {
      pdVar4 = pdVar20 + lVar19;
      dVar6 = pdVar4[1];
      dVar7 = pdVar4[2];
      dVar8 = pdVar4[3];
      dVar9 = pdVar4[4];
      dVar10 = pdVar4[5];
      dVar11 = pdVar4[6];
      dVar12 = pdVar4[7];
      pdVar1 = local_98.m_storage.m_data + lVar19;
      *pdVar1 = *pdVar4;
      pdVar1[1] = dVar6;
      pdVar1[2] = dVar7;
      pdVar1[3] = dVar8;
      pdVar1[4] = dVar9;
      pdVar1[5] = dVar10;
      pdVar1[6] = dVar11;
      pdVar1[7] = dVar12;
      lVar19 = lVar19 + 8;
    } while (lVar19 < (long)uVar17);
  }
  if ((long)uVar17 < (long)uVar21) {
    do {
      local_98.m_storage.m_data[uVar17] = pdVar20[uVar17];
      uVar17 = uVar17 + 1;
    } while (uVar21 != uVar17);
  }
  local_c8.m_storage.m_data = (double *)0x0;
  local_c8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_c8,size_00);
  local_a8.m_storage.m_data = (double *)0x0;
  local_a8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_a8,size_00);
  ChState::ChState(&local_48,(long)iVar15,(ChIntegrable *)0x0);
  ChStateDelta::ChStateDelta(&local_60,size_00,(ChIntegrable *)0x0);
  local_78 = state_w;
  local_68 = state_x;
  ChStateDelta::setZero(&local_60,size_00,(ChIntegrable *)0x0);
  if (0 < local_7c) {
    lVar19 = 0;
    uVar21 = 0;
    do {
      if (local_60.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
          (long)uVar21) goto LAB_00126eaa;
      local_60.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar21] =
           local_60.super_ChVectorDynamic<double>.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar21] +
           1e-08;
      (**(code **)(*(long *)local_b0 + 0x50))(local_b0,local_68,&local_60);
      ChLoaderUVWdistributed::ComputeQ
                (&local_70->super_ChLoaderUVWdistributed,&local_48.super_ChVectorDynamic<double>,
                 &local_78->super_ChVectorDynamic<double>);
      pdVar20 = (local_b0->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.super_ChLoader.Q.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      uVar17 = *(Index *)((long)&(local_b0->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.
                                 super_ChLoader.Q.
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                 m_storage + 8);
      if (local_c8.m_storage.m_rows != uVar17) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_c8,uVar17,1);
        if (local_c8.m_storage.m_rows != uVar17) goto LAB_00126f54;
      }
      pdVar1 = local_98.m_storage.m_data;
      IVar13 = local_c8.m_storage.m_rows;
      pdVar4 = local_c8.m_storage.m_data;
      uVar16 = uVar17 + 7;
      if (-1 < (long)uVar17) {
        uVar16 = uVar17;
      }
      uVar16 = uVar16 & 0xfffffffffffffff8;
      if (7 < (long)uVar17) {
        lVar18 = 0;
        do {
          pdVar2 = pdVar20 + lVar18;
          dVar6 = pdVar2[1];
          dVar7 = pdVar2[2];
          dVar8 = pdVar2[3];
          dVar9 = pdVar2[4];
          dVar10 = pdVar2[5];
          dVar11 = pdVar2[6];
          dVar12 = pdVar2[7];
          pdVar3 = local_c8.m_storage.m_data + lVar18;
          *pdVar3 = *pdVar2;
          pdVar3[1] = dVar6;
          pdVar3[2] = dVar7;
          pdVar3[3] = dVar8;
          pdVar3[4] = dVar9;
          pdVar3[5] = dVar10;
          pdVar3[6] = dVar11;
          pdVar3[7] = dVar12;
          lVar18 = lVar18 + 8;
        } while (lVar18 < (long)uVar16);
      }
      if ((long)uVar16 < (long)uVar17) {
        do {
          local_c8.m_storage.m_data[uVar16] = pdVar20[uVar16];
          uVar16 = uVar16 + 1;
        } while (uVar17 != uVar16);
      }
      if (local_60.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
          (long)uVar21) goto LAB_00126eaa;
      local_60.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar21] =
           local_60.super_ChVectorDynamic<double>.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar21] +
           -1e-08;
      if (local_c8.m_storage.m_rows != local_98.m_storage.m_rows) goto LAB_00126f32;
      if (local_c8.m_storage.m_rows < 0) goto LAB_00126f10;
      if (local_a8.m_storage.m_rows != local_c8.m_storage.m_rows) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&local_a8,local_c8.m_storage.m_rows,1);
        if (local_a8.m_storage.m_rows != IVar13) goto LAB_00126f6b;
      }
      auVar22 = vbroadcastsd_avx512f(ZEXT816(0xc197d78400000000));
      uVar17 = IVar13 & 0x7ffffffffffffff8;
      if (7 < (ulong)IVar13) {
        uVar16 = 0;
        do {
          auVar23 = vsubpd_avx512f(*(undefined1 (*) [64])(pdVar4 + uVar16),
                                   *(undefined1 (*) [64])(pdVar1 + uVar16));
          auVar23 = vmulpd_avx512f(auVar23,auVar22);
          *(undefined1 (*) [64])(local_a8.m_storage.m_data + uVar16) = auVar23;
          uVar16 = uVar16 + 8;
        } while (uVar16 < uVar17);
      }
      if ((long)uVar17 < IVar13) {
        do {
          local_a8.m_storage.m_data[uVar17] = (pdVar4[uVar17] - pdVar1[uVar17]) * -100000000.0;
          uVar17 = uVar17 + 1;
        } while (IVar13 != uVar17);
      }
      lVar18 = *(long *)&local_b0->field_0x38;
      if ((*(long *)(lVar18 + 0x40) < (long)size_00) ||
         (lVar5 = *(long *)(lVar18 + 0x48), lVar5 <= (long)uVar21)) goto LAB_00126ecc;
      if (IVar13 != size_00) goto LAB_00126eee;
      uVar17 = 0;
      pdVar20 = (double *)(*(long *)(lVar18 + 0x38) + lVar19);
      do {
        pdVar4 = local_a8.m_storage.m_data + uVar17;
        uVar17 = uVar17 + 1;
        *pdVar20 = *pdVar4;
        pdVar20 = pdVar20 + lVar5;
      } while (size_00 != uVar17);
      uVar21 = uVar21 + 1;
      lVar19 = lVar19 + 8;
    } while (uVar21 != size_00);
    if (0 < local_7c) {
      lVar19 = 0;
      uVar21 = 0;
      do {
        if ((local_78->super_ChVectorDynamic<double>).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
            (long)uVar21) {
LAB_00126eaa:
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        pdVar20 = (local_78->super_ChVectorDynamic<double>).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        pdVar20[uVar21] = pdVar20[uVar21] + 1e-08;
        ChLoaderUVWdistributed::ComputeQ
                  (&local_70->super_ChLoaderUVWdistributed,&local_68->super_ChVectorDynamic<double>,
                   &local_78->super_ChVectorDynamic<double>);
        pdVar20 = (local_b0->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.super_ChLoader.Q
                  .super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        uVar17 = *(Index *)((long)&(local_b0->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW
                                   .super_ChLoader.Q.
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                   m_storage + 8);
        if (local_c8.m_storage.m_rows != uVar17) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&local_c8,uVar17,1);
          if (local_c8.m_storage.m_rows != uVar17) goto LAB_00126f54;
        }
        pdVar1 = local_98.m_storage.m_data;
        IVar13 = local_c8.m_storage.m_rows;
        pdVar4 = local_c8.m_storage.m_data;
        uVar16 = uVar17 + 7;
        if (-1 < (long)uVar17) {
          uVar16 = uVar17;
        }
        uVar16 = uVar16 & 0xfffffffffffffff8;
        if (7 < (long)uVar17) {
          lVar18 = 0;
          do {
            pdVar2 = pdVar20 + lVar18;
            dVar6 = pdVar2[1];
            dVar7 = pdVar2[2];
            dVar8 = pdVar2[3];
            dVar9 = pdVar2[4];
            dVar10 = pdVar2[5];
            dVar11 = pdVar2[6];
            dVar12 = pdVar2[7];
            pdVar3 = local_c8.m_storage.m_data + lVar18;
            *pdVar3 = *pdVar2;
            pdVar3[1] = dVar6;
            pdVar3[2] = dVar7;
            pdVar3[3] = dVar8;
            pdVar3[4] = dVar9;
            pdVar3[5] = dVar10;
            pdVar3[6] = dVar11;
            pdVar3[7] = dVar12;
            lVar18 = lVar18 + 8;
          } while (lVar18 < (long)uVar16);
        }
        if ((long)uVar16 < (long)uVar17) {
          do {
            local_c8.m_storage.m_data[uVar16] = pdVar20[uVar16];
            uVar16 = uVar16 + 1;
          } while (uVar17 != uVar16);
        }
        if ((local_78->super_ChVectorDynamic<double>).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
            (long)uVar21) goto LAB_00126eaa;
        pdVar20 = (local_78->super_ChVectorDynamic<double>).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        pdVar20[uVar21] = pdVar20[uVar21] + -1e-08;
        if (local_c8.m_storage.m_rows != local_98.m_storage.m_rows) {
LAB_00126f32:
          __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                        "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
                       );
        }
        if (local_c8.m_storage.m_rows < 0) {
LAB_00126f10:
          __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                        ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
                       );
        }
        if (local_a8.m_storage.m_rows != local_c8.m_storage.m_rows) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&local_a8,local_c8.m_storage.m_rows,1);
          if (local_a8.m_storage.m_rows != IVar13) goto LAB_00126f6b;
        }
        auVar22 = vbroadcastsd_avx512f(ZEXT816(0xc197d78400000000));
        uVar17 = IVar13 & 0x7ffffffffffffff8;
        if (7 < (ulong)IVar13) {
          uVar16 = 0;
          do {
            auVar23 = vsubpd_avx512f(*(undefined1 (*) [64])(pdVar4 + uVar16),
                                     *(undefined1 (*) [64])(pdVar1 + uVar16));
            auVar23 = vmulpd_avx512f(auVar23,auVar22);
            *(undefined1 (*) [64])(local_a8.m_storage.m_data + uVar16) = auVar23;
            uVar16 = uVar16 + 8;
          } while (uVar16 < uVar17);
        }
        if ((long)uVar17 < IVar13) {
          do {
            local_a8.m_storage.m_data[uVar17] = (pdVar4[uVar17] - pdVar1[uVar17]) * -100000000.0;
            uVar17 = uVar17 + 1;
          } while (IVar13 != uVar17);
        }
        lVar18 = *(long *)&local_b0->field_0x38;
        if ((*(long *)(lVar18 + 0x58) < (long)size_00) ||
           (lVar5 = *(long *)(lVar18 + 0x60), lVar5 <= (long)uVar21)) {
LAB_00126ecc:
          __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                        ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                        "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                       );
        }
        if (IVar13 != size_00) {
LAB_00126eee:
          __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                        "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>>]"
                       );
        }
        uVar17 = 0;
        pdVar20 = (double *)(*(long *)(lVar18 + 0x50) + lVar19);
        do {
          pdVar4 = local_a8.m_storage.m_data + uVar17;
          uVar17 = uVar17 + 1;
          *pdVar20 = *pdVar4;
          pdVar20 = pdVar20 + lVar5;
        } while (size_00 != uVar17);
        uVar21 = uVar21 + 1;
        lVar19 = lVar19 + 8;
      } while (uVar21 != size_00);
    }
  }
  if (local_60.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)local_60.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[-1]
        );
  }
  if (local_48.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)local_48.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[-1]
        );
  }
  if (local_a8.m_storage.m_data != (double *)0x0) {
    free((void *)local_a8.m_storage.m_data[-1]);
  }
  if (local_c8.m_storage.m_data != (double *)0x0) {
    free((void *)local_c8.m_storage.m_data[-1]);
  }
  if (local_98.m_storage.m_data != (double *)0x0) {
    free((void *)local_98.m_storage.m_data[-1]);
  }
  return;
LAB_00126f6b:
  __function = 
  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>>, T1 = double, T2 = double]"
  ;
LAB_00126f80:
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,__function);
}

Assistant:

inline void ChLoad<Tloader>::ComputeJacobian(ChState* state_x,
                                             ChStateDelta* state_w,
                                             ChMatrixRef mK,
                                             ChMatrixRef mR,
                                             ChMatrixRef mM) {
    double Delta = 1e-8;

    int mrows_w = this->LoadGet_ndof_w();
    int mrows_x = this->LoadGet_ndof_x();

    // compute Q at current speed & position, x_0, v_0
    ChVectorDynamic<> Q0(mrows_w);
    this->loader.ComputeQ(state_x, state_w);  // Q0 = Q(x, v)
    Q0 = this->loader.Q;

    ChVectorDynamic<> Q1(mrows_w);
    ChVectorDynamic<> Jcolumn(mrows_w);
    ChState state_x_inc(mrows_x, nullptr);
    ChStateDelta state_delta(mrows_w, nullptr);

    // Compute K=-dQ(x,v)/dx by backward differentiation
    state_delta.setZero(mrows_w, nullptr);

    for (int i = 0; i < mrows_w; ++i) {
        state_delta(i) += Delta;
        this->LoadStateIncrement(*state_x, state_delta,
                                 state_x_inc);         // exponential, usually state_x_inc(i) = state_x(i) + Delta;
        this->loader.ComputeQ(&state_x_inc, state_w);  // Q1 = Q(x+Dx, v)
        Q1 = this->loader.Q;
        state_delta(i) -= Delta;

        Jcolumn = (Q1 - Q0) * (-1.0 / Delta);  // - sign because K=-dQ/dx
        this->jacobians->K.block(0, i, mrows_w, 1) = Jcolumn;
    }
    // Compute R=-dQ(x,v)/dv by backward differentiation
    for (int i = 0; i < mrows_w; ++i) {
        (*state_w)(i) += Delta;
        this->loader.ComputeQ(state_x, state_w);  // Q1 = Q(x, v+Dv)
        Q1 = this->loader.Q;
        (*state_w)(i) -= Delta;

        Jcolumn = (Q1 - Q0) * (-1.0 / Delta);  // - sign because R=-dQ/dv
        this->jacobians->R.block(0, i, mrows_w, 1) = Jcolumn;
    }
}